

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O2

void __thiscall
QGraphicsItemPrivate::clearFocusHelper
          (QGraphicsItemPrivate *this,bool giveFocusToParent,bool hiddenByParentPanel)

{
  QGraphicsItem *pQVar1;
  QGraphicsItem *pQVar2;
  QGraphicsItem *pQVar3;
  QGraphicsItem *this_00;
  QGraphicsItem *pQVar4;
  bool bVar5;
  QGraphicsItemPrivate *pQVar6;
  
  pQVar1 = this->q_ptr;
  pQVar2 = (QGraphicsItem *)(*(ulong *)&this->field_0x160 >> 0x2f & 1);
  pQVar4 = pQVar1;
  this_00 = pQVar1;
  while (pQVar3 = pQVar4, pQVar2 != (QGraphicsItem *)0x0) {
    pQVar2 = ((pQVar3->d_ptr).d)->focusScopeItem;
    pQVar4 = pQVar2;
    this_00 = pQVar3;
  }
  pQVar6 = this;
  if (giveFocusToParent && ((uint)(*(ulong *)&this->field_0x160 >> 0x37) & 1) == 0) {
    do {
      pQVar2 = pQVar6->parent;
      if (pQVar2 == (QGraphicsItem *)0x0) goto LAB_00574c52;
      pQVar6 = (pQVar2->d_ptr).d;
    } while ((*(ulong *)&pQVar6->field_0x160 & 0x800000000000) == 0);
    if (pQVar6->focusScopeItem == pQVar1) {
      pQVar6->focusScopeItem = (QGraphicsItem *)0x0;
      bVar5 = QGraphicsItem::hasFocus(this_00);
      if (!bVar5) {
        (*this->_vptr_QGraphicsItemPrivate[9])(this,0);
      }
    }
    bVar5 = QGraphicsItem::hasFocus(this_00);
    if (bVar5) {
      setFocusHelper((pQVar2->d_ptr).d,OtherFocusReason,false,false);
      return;
    }
  }
  else {
LAB_00574c52:
    bVar5 = QGraphicsItem::hasFocus(this_00);
    if (bVar5) {
      if (!hiddenByParentPanel) {
        clearSubFocus(this,this->q_ptr,(QGraphicsItem *)0x0);
      }
      QGraphicsScene::setFocusItem
                ((QGraphicsScene *)this->scene,(QGraphicsItem *)0x0,OtherFocusReason);
      return;
    }
  }
  return;
}

Assistant:

void QGraphicsItemPrivate::clearFocusHelper(bool giveFocusToParent, bool hiddenByParentPanel)
{
    QGraphicsItem *subFocusItem = q_ptr;
    if (flags & QGraphicsItem::ItemIsFocusScope) {
        while (subFocusItem->d_ptr->focusScopeItem)
            subFocusItem = subFocusItem->d_ptr->focusScopeItem;
    }

    if (giveFocusToParent) {
        // Pass focus to the closest parent focus scope
        if (!inDestructor) {
            QGraphicsItem *p = parent;
            while (p) {
                if (p->flags() & QGraphicsItem::ItemIsFocusScope) {
                    if (p->d_ptr->focusScopeItem == q_ptr) {
                        p->d_ptr->focusScopeItem = nullptr;
                        if (!subFocusItem->hasFocus()) //if it has focus, focusScopeItemChange is called elsewhere
                            focusScopeItemChange(false);
                    }
                    if (subFocusItem->hasFocus())
                        p->d_ptr->setFocusHelper(Qt::OtherFocusReason, /* climb = */ false,
                                                 /* focusFromHide = */ false);
                    return;
                }
                p = p->d_ptr->parent;
            }
        }
    }

    if (subFocusItem->hasFocus()) {
        // Invisible items with focus must explicitly clear subfocus.
        if (!hiddenByParentPanel)
            clearSubFocus(q_ptr);

        // If this item has the scene's input focus, clear it.
        scene->setFocusItem(nullptr);
    }
}